

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPath.c
# Opt level: O3

void Abc_GraphBuildFrontier
               (int nSize,Vec_Int_t *vEdges,Vec_Int_t *vLife,Vec_Wec_t *vFronts,int fVerbose)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  void *__ptr;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  Vec_Wec_t *p;
  Vec_Int_t *pVVar8;
  int *piVar9;
  Vec_Int_t *p_00;
  Hsh_VecMan_t *p_01;
  Hsh_VecMan_t *__ptr_00;
  Vec_Int_t *pVVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  size_t __nmemb;
  Hsh_VecMan_t *__ptr_01;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  bool bVar20;
  long local_80;
  timespec ts;
  
  iVar5 = clock_gettime(3,(timespec *)&ts);
  if (iVar5 < 0) {
    local_80 = 1;
  }
  else {
    lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
    local_80 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + ts.tv_sec * -1000000;
  }
  iVar5 = vEdges->nSize;
  uVar16 = iVar5 / 2;
  iVar17 = vLife->nSize / 2;
  p = (Vec_Wec_t *)malloc(0x10);
  uVar1 = uVar16 - 1;
  uVar11 = 8;
  if (6 < uVar1) {
    uVar11 = uVar16;
  }
  p->nSize = 0;
  p->nCap = uVar11;
  if (uVar11 == 0) {
    pVVar8 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar8 = (Vec_Int_t *)calloc((long)(int)uVar11,0x10);
  }
  p->pArray = pVVar8;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  iVar12 = iVar17;
  if (iVar17 - 1U < 0xf) {
    iVar12 = 0x10;
  }
  pVVar8->nSize = 0;
  pVVar8->nCap = iVar12;
  if (iVar12 == 0) {
    piVar9 = (int *)0x0;
  }
  else {
    piVar9 = (int *)malloc((long)iVar12 << 2);
  }
  pVVar8->pArray = piVar9;
  p_00 = (Vec_Int_t *)malloc(0x10);
  uVar11 = 0x10;
  if (0xe < uVar1) {
    uVar11 = uVar16;
  }
  p_00->nSize = 0;
  p_00->nCap = uVar11;
  if (uVar11 == 0) {
    piVar9 = (int *)0x0;
  }
  else {
    piVar9 = (int *)malloc((long)(int)uVar11 << 2);
  }
  p_00->pArray = piVar9;
  __nmemb = (size_t)iVar17;
  piVar9 = (int *)calloc(__nmemb,4);
  iVar17 = (int)__nmemb;
  p_01 = Hsh_VecManStart(iVar17);
  __ptr_00 = Hsh_VecManStart(iVar17);
  Hsh_VecManAdd(p_01,pVVar8);
  if (1 < iVar5) {
    uVar19 = 0;
    __ptr_01 = p_01;
    do {
      p_01 = __ptr_00;
      pVVar10 = Vec_WecPushLevel(p);
      uVar11 = __ptr_01->vMap->nSize;
      Vec_IntPush(p_00,uVar11);
      if (fVerbose != 0) {
        putchar(10);
        if (((long)vEdges->nSize <= (long)(uVar19 * 2)) ||
           ((ulong)(uint)vEdges->nSize <= (uVar19 * 2 | 1))) {
LAB_00497517:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        printf("Processing edge %d = {%d %d}\n",uVar19 & 0xffffffff,
               (ulong)(uint)vEdges->pArray[uVar19 * 2]);
        printf("Frontier: ");
        if ((long)vFronts->nSize <= (long)uVar19) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                        ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
        }
        pVVar2 = vFronts->pArray;
        printf("Vector has %d entries: {",(ulong)(uint)pVVar2[uVar19].nSize);
        if (0 < pVVar2[uVar19].nSize) {
          lVar14 = 0;
          do {
            printf(" %d",(ulong)(uint)pVVar2[uVar19].pArray[lVar14]);
            lVar14 = lVar14 + 1;
          } while (lVar14 < pVVar2[uVar19].nSize);
        }
        puts(" }");
        putchar(10);
      }
      if (0 < (int)uVar11) {
        uVar15 = 0;
        do {
          if ((long)__ptr_01->vMap->nSize <= (long)uVar15) goto LAB_00497517;
          iVar5 = __ptr_01->vMap->pArray[uVar15];
          if (((long)iVar5 < 0) || (__ptr_01->vData->nSize <= iVar5)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
          }
          piVar3 = __ptr_01->vData->pArray + iVar5;
          iVar5 = *piVar3;
          (__ptr_01->vTemp).nCap = iVar5;
          (__ptr_01->vTemp).nSize = iVar5;
          (__ptr_01->vTemp).pArray = piVar3 + 2;
          iVar5 = 0;
          bVar4 = true;
          do {
            bVar20 = bVar4;
            uVar6 = Abc_GraphBuildState(&__ptr_01->vTemp,(int)uVar19,iVar5,vEdges,vLife,vFronts,
                                        piVar9,pVVar8,fVerbose);
            uVar7 = uVar6;
            if (uVar6 == 1) {
              uVar7 = 0xfffffffe;
            }
            uVar18 = (ulong)uVar7;
            if ((uVar6 == 1) && (uVar19 != uVar1)) {
              uVar7 = Hsh_VecManAdd(p_01,pVVar8);
              uVar18 = (ulong)uVar7;
            }
            if (fVerbose != 0) {
              printf("Return value = %d\n",uVar18);
            }
            Vec_IntPush(pVVar10,(int)uVar18);
            iVar5 = 1;
            bVar4 = false;
          } while (bVar20);
          uVar15 = uVar15 + 1;
        } while (uVar15 != uVar11);
      }
      pVVar10 = __ptr_01->vTable;
      piVar3 = pVVar10->pArray;
      if (piVar3 != (int *)0x0) {
        free(piVar3);
      }
      free(pVVar10);
      pVVar10 = __ptr_01->vData;
      piVar3 = pVVar10->pArray;
      if (piVar3 != (int *)0x0) {
        free(piVar3);
      }
      free(pVVar10);
      pVVar10 = __ptr_01->vMap;
      piVar3 = pVVar10->pArray;
      if (piVar3 != (int *)0x0) {
        free(piVar3);
      }
      free(pVVar10);
      free(__ptr_01);
      __ptr_00 = Hsh_VecManStart((int)__ptr_01);
      uVar19 = uVar19 + 1;
      __ptr_01 = p_01;
    } while (uVar19 != uVar16);
  }
  Abc_GraphCountPaths(p,vEdges);
  uVar1 = p_00->nSize;
  lVar14 = (long)(int)uVar1;
  if (lVar14 < 1) {
    uVar19 = 0;
  }
  else {
    lVar13 = 0;
    uVar19 = 0;
    do {
      uVar19 = (ulong)(uint)((int)uVar19 + p_00->pArray[lVar13]);
      lVar13 = lVar13 + 1;
    } while (lVar14 != lVar13);
  }
  printf("States = %8d   Paths = %24.0f  ",uVar19);
  iVar17 = 3;
  iVar5 = clock_gettime(3,(timespec *)&ts);
  if (iVar5 < 0) {
    lVar13 = -1;
  }
  else {
    lVar13 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
  }
  Abc_Print(iVar17,"%s =","Time");
  Abc_Print(iVar17,"%9.2f sec\n",(double)(lVar13 + local_80) / 1000000.0);
  if (fVerbose != 0) {
    printf("Vector has %d entries: {",(ulong)uVar1);
    if (0 < (int)uVar1) {
      piVar3 = p_00->pArray;
      lVar13 = 0;
      do {
        printf(" %d",(ulong)(uint)piVar3[lVar13]);
        lVar13 = lVar13 + 1;
      } while (lVar14 != lVar13);
    }
    puts(" }");
  }
  Abc_GraphDeriveGiaDump(p,vEdges,nSize);
  if (piVar9 != (int *)0x0) {
    free(piVar9);
  }
  iVar5 = p->nCap;
  pVVar10 = p->pArray;
  if (iVar5 < 1) {
    if (pVVar10 == (Vec_Int_t *)0x0) goto LAB_004973f8;
  }
  else {
    lVar14 = 8;
    lVar13 = 0;
    do {
      __ptr = *(void **)((long)&pVVar10->nCap + lVar14);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        pVVar10 = p->pArray;
        *(undefined8 *)((long)&pVVar10->nCap + lVar14) = 0;
        iVar5 = p->nCap;
      }
      lVar13 = lVar13 + 1;
      lVar14 = lVar14 + 0x10;
    } while (lVar13 < iVar5);
  }
  free(pVVar10);
LAB_004973f8:
  free(p);
  if (pVVar8->pArray != (int *)0x0) {
    free(pVVar8->pArray);
  }
  free(pVVar8);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
  }
  free(p_00);
  pVVar8 = p_01->vTable;
  piVar9 = pVVar8->pArray;
  if (piVar9 != (int *)0x0) {
    free(piVar9);
  }
  free(pVVar8);
  pVVar8 = p_01->vData;
  piVar9 = pVVar8->pArray;
  if (piVar9 != (int *)0x0) {
    free(piVar9);
  }
  free(pVVar8);
  pVVar8 = p_01->vMap;
  piVar9 = pVVar8->pArray;
  if (piVar9 != (int *)0x0) {
    free(piVar9);
  }
  free(pVVar8);
  free(p_01);
  pVVar8 = __ptr_00->vTable;
  piVar9 = pVVar8->pArray;
  if (piVar9 != (int *)0x0) {
    free(piVar9);
  }
  free(pVVar8);
  pVVar8 = __ptr_00->vData;
  piVar9 = pVVar8->pArray;
  if (piVar9 != (int *)0x0) {
    free(piVar9);
  }
  free(pVVar8);
  pVVar8 = __ptr_00->vMap;
  piVar9 = pVVar8->pArray;
  if (piVar9 != (int *)0x0) {
    free(piVar9);
  }
  free(pVVar8);
  free(__ptr_00);
  return;
}

Assistant:

void Abc_GraphBuildFrontier( int nSize, Vec_Int_t * vEdges, Vec_Int_t * vLife, Vec_Wec_t * vFronts, int fVerbose )
{
    abctime clk = Abc_Clock();
    double nPaths;
    int nEdges = Vec_IntSize(vEdges)/2;
    int nNodes = Vec_IntSize(vLife)/2;
    Vec_Wec_t * vNodes = Vec_WecAlloc( nEdges );
    Vec_Int_t * vStateNew = Vec_IntAlloc( nNodes );
    Vec_Int_t * vStateCount = Vec_IntAlloc( nEdges );
    int e, s, x, Next, * pFront = ABC_CALLOC( int, nNodes );
    Hsh_VecMan_t * pThis = Hsh_VecManStart( 1000 );
    Hsh_VecMan_t * pNext = Hsh_VecManStart( 1000 );
    Hsh_VecManAdd( pThis, vStateNew );
    for ( e = 0; e < nEdges; e++ )
    {
        Vec_Int_t * vNode = Vec_WecPushLevel(vNodes);
        int nStates = Hsh_VecSize( pThis );
        Vec_IntPush( vStateCount, nStates );
        if ( fVerbose )
        {
            printf( "\n" );
            printf( "Processing edge %d = {%d %d}\n", e, Vec_IntEntry(vEdges, 2*e), Vec_IntEntry(vEdges, 2*e+1) );
            printf( "Frontier: " );  Vec_IntPrint( Vec_WecEntry(vFronts, e) );
            printf( "\n" );
        }
        for ( s = 0; s < nStates; s++ )
        {
            Vec_Int_t * vState = Hsh_VecReadEntry(pThis, s);
            for ( x = 0; x < 2; x++ )
            {
                Next = Abc_GraphBuildState(vState, e, x, vEdges, vLife, vFronts, pFront, vStateNew, fVerbose);
                if ( Next == 1 )
                {
                    if ( e == nEdges - 1 ) // last edge
                        Next = -2; // const1
                    else
                        Next = Hsh_VecManAdd( pNext, vStateNew );
                }
                if ( fVerbose ) printf( "Return value = %d\n", Next );
                Vec_IntPush( vNode, Next );
            }
        }
        Hsh_VecManStop( pThis );
        pThis = pNext;
        pNext = Hsh_VecManStart( 1000 );
    }
    nPaths = Abc_GraphCountPaths(vNodes, vEdges);
    printf( "States = %8d   Paths = %24.0f  ", Vec_IntSum(vStateCount), nPaths ); 
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( fVerbose )
        Vec_IntPrint( vStateCount );
    Abc_GraphDeriveGiaDump( vNodes, vEdges, nSize );
    ABC_FREE( pFront );
    Vec_WecFree( vNodes );
    Vec_IntFree( vStateNew );
    Vec_IntFree( vStateCount );
    Hsh_VecManStop( pThis );
    Hsh_VecManStop( pNext );
}